

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O1

void keyboardCallback(GLFWwindow *window,int key,int param_3,int action,int param_5)

{
  ImGuiIO *pIVar1;
  
  pIVar1 = ImGui::GetIO();
  if ((action == 1) && (pIVar1->WantCaptureKeyboard == false)) {
    if (key == 0x52) {
      loadPrograms();
      g_patch.flags.reset = true;
    }
    else if (key == 0x100) {
      g_app.viewer.hud = (bool)(g_app.viewer.hud ^ 1);
    }
  }
  return;
}

Assistant:

void
keyboardCallback(
    GLFWwindow* window,
    int key, int, int action, int
) {
    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureKeyboard)
        return;

    if (action == GLFW_PRESS) {
        switch (key) {
            case GLFW_KEY_ESCAPE:
                //glfwSetWindowShouldClose(window, GL_TRUE);
                g_app.viewer.hud = !g_app.viewer.hud;
            break;
            case GLFW_KEY_R:
                loadPrograms();
                g_patch.flags.reset = true;
            break;
            default: break;
        }
    }
}